

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O2

void __thiscall
glcts::ArraysOfArrays::InteractionUniformBuffers2<glcts::ArraysOfArrays::Interface::ES>::
test_shader_compilation
          (InteractionUniformBuffers2<glcts::ArraysOfArrays::Interface::ES> *this,
          TestShaderType tested_shader_type)

{
  int iVar1;
  deUint32 dVar2;
  undefined4 extraout_var;
  iterator iVar4;
  long lVar5;
  TestError *pTVar6;
  test_var_type *__k;
  GLint buffer_data [16];
  string uniform_definition;
  string uniform_use;
  GLuint buffer_object_id;
  long lVar3;
  
  iVar1 = (*((this->super_InteractionUniforms1<glcts::ArraysOfArrays::Interface::ES>).
             super_TestCaseBase<glcts::ArraysOfArrays::Interface::ES>.context_id)->m_renderCtx->
            _vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  __k = test_shader_compilation::var_types_set_es;
  lVar5 = 0;
  while( true ) {
    if (lVar5 == 3) {
      return;
    }
    iVar4 = std::
            _Rb_tree<glcts::test_var_type,_std::pair<const_glcts::test_var_type,_glcts::var_descriptor>,_std::_Select1st<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
            ::find((_Rb_tree<glcts::test_var_type,_std::pair<const_glcts::test_var_type,_glcts::var_descriptor>,_std::_Select1st<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                    *)supported_variable_types_map,__k);
    if (iVar4._M_node == (_Base_ptr)(supported_variable_types_map + 8)) break;
    uniform_definition._M_dataplus._M_p = (pointer)&uniform_definition.field_2;
    uniform_definition._M_string_length = 0;
    uniform_definition.field_2._M_local_buf[0] = '\0';
    uniform_use._M_dataplus._M_p = (pointer)&uniform_use.field_2;
    uniform_use._M_string_length = 0;
    uniform_use.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::append((char *)&uniform_definition);
    std::__cxx11::string::append((char *)&uniform_definition);
    std::__cxx11::string::append((string *)&uniform_definition);
    std::__cxx11::string::append((char *)&uniform_definition);
    std::__cxx11::string::assign((char *)&uniform_use);
    InteractionUniforms1<glcts::ArraysOfArrays::Interface::ES>::prepare_fragment_shader
              ((string *)buffer_data,
               &this->super_InteractionUniforms1<glcts::ArraysOfArrays::Interface::ES>,
               tested_shader_type,&uniform_definition,&uniform_use);
    InteractionUniforms1<glcts::ArraysOfArrays::Interface::ES>::prepare_vertex_shader
              ((string *)&buffer_object_id,
               &this->super_InteractionUniforms1<glcts::ArraysOfArrays::Interface::ES>,
               tested_shader_type,&uniform_definition,&uniform_use);
    (*(this->super_InteractionUniforms1<glcts::ArraysOfArrays::Interface::ES>).
      super_TestCaseBase<glcts::ArraysOfArrays::Interface::ES>.super_TestCase.super_TestNode.
      _vptr_TestNode[9])(this,(string *)&buffer_object_id,(string *)buffer_data,0,0);
    std::__cxx11::string::~string((string *)&buffer_object_id);
    std::__cxx11::string::~string((string *)buffer_data);
    buffer_object_id = 0;
    (**(code **)(lVar3 + 0x1680))
              ((this->super_InteractionUniforms1<glcts::ArraysOfArrays::Interface::ES>).
               super_TestCaseBase<glcts::ArraysOfArrays::Interface::ES>.program_object_id);
    dVar2 = (**(code **)(lVar3 + 0x800))();
    glu::checkError(dVar2,"glUseProgram() failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                    ,0x1b55);
    iVar1 = (**(code **)(lVar3 + 0xb38))
                      ((this->super_InteractionUniforms1<glcts::ArraysOfArrays::Interface::ES>).
                       super_TestCaseBase<glcts::ArraysOfArrays::Interface::ES>.program_object_id,
                       "uniform_block_name");
    dVar2 = (**(code **)(lVar3 + 0x800))();
    glu::checkError(dVar2,"glGetUniformBlockIndex() failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                    ,7000);
    if (iVar1 == -1) {
      pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar6,"Uniform block not found or is considered as not active.",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                 ,0x1b5c);
      __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    (**(code **)(lVar3 + 0x6c8))(1,(string *)&buffer_object_id);
    dVar2 = (**(code **)(lVar3 + 0x800))();
    glu::checkError(dVar2,"glGenBuffers() failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                    ,0x1b60);
    (**(code **)(lVar3 + 0x40))(0x8a11,buffer_object_id);
    dVar2 = (**(code **)(lVar3 + 0x800))();
    glu::checkError(dVar2,"glBindBuffer() failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                    ,0x1b63);
    if (lVar5 == 2) {
      buffer_data[0xc] = 0xc;
      buffer_data[0xd] = 0xd;
      buffer_data[0xe] = 0xe;
      buffer_data[0xf] = 0xf;
      buffer_data[8] = 8;
      buffer_data[9] = 9;
      buffer_data[10] = 10;
      buffer_data[0xb] = 0xb;
      buffer_data[4] = 4;
      buffer_data[5] = 5;
      buffer_data[6] = 6;
      buffer_data[7] = 7;
      buffer_data[0] = 0;
      buffer_data[1] = 1;
      buffer_data[2] = 2;
      buffer_data[3] = 3;
      (**(code **)(lVar3 + 0x150))(0x8a11,0x40,buffer_data,0x88e4);
      dVar2 = (**(code **)(lVar3 + 0x800))();
      glu::checkError(dVar2,"glBufferData() failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                      ,0x1b80);
    }
    else if (lVar5 == 1) {
      buffer_data[0xc] = 0xc;
      buffer_data[0xd] = 0xd;
      buffer_data[0xe] = 0xe;
      buffer_data[0xf] = 0xf;
      buffer_data[8] = 8;
      buffer_data[9] = 9;
      buffer_data[10] = 10;
      buffer_data[0xb] = 0xb;
      buffer_data[4] = 4;
      buffer_data[5] = 5;
      buffer_data[6] = 6;
      buffer_data[7] = 7;
      buffer_data[0] = 0;
      buffer_data[1] = 1;
      buffer_data[2] = 2;
      buffer_data[3] = 3;
      (**(code **)(lVar3 + 0x150))(0x8a11,0x40,buffer_data,0x88e4);
      dVar2 = (**(code **)(lVar3 + 0x800))();
      glu::checkError(dVar2,"glBufferData() failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                      ,0x1b77);
    }
    else {
      buffer_data[0xc] = 0x41400000;
      buffer_data[0xd] = 0x41500000;
      buffer_data[0xe] = 0x41600000;
      buffer_data[0xf] = 0x41700000;
      buffer_data[8] = 0x41000000;
      buffer_data[9] = 0x41100000;
      buffer_data[10] = 0x41200000;
      buffer_data[0xb] = 0x41300000;
      buffer_data[4] = 0x40800000;
      buffer_data[5] = 0x40a00000;
      buffer_data[6] = 0x40c00000;
      buffer_data[7] = 0x40e00000;
      buffer_data[0] = 0;
      buffer_data[1] = 0x3f800000;
      buffer_data[2] = 0x40000000;
      buffer_data[3] = 0x40400000;
      (**(code **)(lVar3 + 0x150))(0x8a11,0x40,buffer_data,0x88e4);
      dVar2 = (**(code **)(lVar3 + 0x800))();
      glu::checkError(dVar2,"glBufferData() failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                      ,0x1b6d);
    }
    (**(code **)(lVar3 + 0x15d0))
              ((this->super_InteractionUniforms1<glcts::ArraysOfArrays::Interface::ES>).
               super_TestCaseBase<glcts::ArraysOfArrays::Interface::ES>.program_object_id,iVar1,0);
    dVar2 = (**(code **)(lVar3 + 0x800))();
    glu::checkError(dVar2,"glUniformBlockBinding() failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                    ,0x1b97);
    (**(code **)(lVar3 + 0x48))(0x8a11,0,buffer_object_id);
    dVar2 = (**(code **)(lVar3 + 0x800))();
    glu::checkError(dVar2,"glBindBufferBase() failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                    ,0x1b9a);
    if (tested_shader_type == COMPUTE_SHADER_TYPE) {
      execute_dispatch_test(this);
    }
    else {
      execute_draw_test(this,tested_shader_type);
    }
    (**(code **)(lVar3 + 0x438))(1,(string *)&buffer_object_id);
    (*(this->super_InteractionUniforms1<glcts::ArraysOfArrays::Interface::ES>).
      super_TestCaseBase<glcts::ArraysOfArrays::Interface::ES>.super_TestCase.super_TestNode.
      _vptr_TestNode[5])(this);
    std::__cxx11::string::~string((string *)&uniform_use);
    std::__cxx11::string::~string((string *)&uniform_definition);
    lVar5 = lVar5 + 1;
    __k = __k + 1;
  }
  pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar6,"Type not found.",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
             ,0x1bab);
  __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void InteractionUniformBuffers2<API>::test_shader_compilation(
	typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	static const glcts::test_var_type var_types_set_es[] = { VAR_TYPE_FLOAT, VAR_TYPE_INT, VAR_TYPE_UINT };
	static const size_t				  num_var_types_es   = sizeof(var_types_set_es) / sizeof(var_types_set_es[0]);

	static const glcts::test_var_type var_types_set_gl[] = { VAR_TYPE_FLOAT, VAR_TYPE_INT, VAR_TYPE_UINT,
															 VAR_TYPE_DOUBLE };
	static const size_t num_var_types_gl = sizeof(var_types_set_gl) / sizeof(var_types_set_gl[0]);

	const glw::Functions&		gl			  = this->context_id.getRenderContext().getFunctions();
	const glcts::test_var_type* var_types_set = var_types_set_es;
	size_t						num_var_types = num_var_types_es;

	if (API::USE_DOUBLE)
	{
		var_types_set = var_types_set_gl;
		num_var_types = num_var_types_gl;
	}

	/* Iterate through float / int / uint values. */
	for (size_t var_type_index = 0; var_type_index < num_var_types; var_type_index++)
	{
		_supported_variable_types_map_const_iterator var_iterator =
			supported_variable_types_map.find(var_types_set[var_type_index]);

		if (var_iterator != supported_variable_types_map.end())
		{
			std::string uniform_definition;
			std::string uniform_use;

			uniform_definition += "layout (std140) uniform uniform_block_name\n"
								  "{\n";
			uniform_definition += "    ";
			uniform_definition += var_iterator->second.type;
			uniform_definition += " my_uniform_1[1][1][1][1];\n"
								  "};\n";

			uniform_use = "    float result = float(my_uniform_1[0][0][0][0]);\n";

			if (API::USE_ALL_SHADER_STAGES)
			{
				const std::string& compute_shader_source =
					this->prepare_compute_shader(tested_shader_type, uniform_definition, uniform_use);
				const std::string& fragment_shader_source =
					this->prepare_fragment_shader(tested_shader_type, uniform_definition, uniform_use);
				const std::string& geometry_shader_source =
					this->prepare_geometry_shader(tested_shader_type, uniform_definition, uniform_use);
				const std::string& tess_ctrl_shader_source =
					this->prepare_tess_ctrl_shader(tested_shader_type, uniform_definition, uniform_use);
				const std::string& tess_eval_shader_source =
					this->prepare_tess_eval_shader(tested_shader_type, uniform_definition, uniform_use);
				const std::string& vertex_shader_source =
					this->prepare_vertex_shader(tested_shader_type, uniform_definition, uniform_use);

				switch (tested_shader_type)
				{
				case TestCaseBase<API>::VERTEX_SHADER_TYPE: /* Fall through */
				case TestCaseBase<API>::FRAGMENT_SHADER_TYPE:
					this->execute_positive_test(vertex_shader_source, fragment_shader_source, false, false);
					break;

				case TestCaseBase<API>::COMPUTE_SHADER_TYPE:
				case TestCaseBase<API>::GEOMETRY_SHADER_TYPE:
				case TestCaseBase<API>::TESSELATION_CONTROL_SHADER_TYPE: /* Fall through */
				case TestCaseBase<API>::TESSELATION_EVALUATION_SHADER_TYPE:
					this->execute_positive_test(vertex_shader_source, tess_ctrl_shader_source, tess_eval_shader_source,
												geometry_shader_source, fragment_shader_source, compute_shader_source,
												false, false);
					break;

				default:
					TCU_FAIL("Invalid enum");
					break;
				}
			}
			else
			{
				const std::string& fragment_shader_source =
					this->prepare_fragment_shader(tested_shader_type, uniform_definition, uniform_use);
				const std::string& vertex_shader_source =
					this->prepare_vertex_shader(tested_shader_type, uniform_definition, uniform_use);

				this->execute_positive_test(vertex_shader_source, fragment_shader_source, false, false);
			}

			glw::GLuint buffer_object_id	   = 0;
			glw::GLint  my_uniform_block_index = GL_INVALID_INDEX;

			gl.useProgram(this->program_object_id);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram() failed.");

			my_uniform_block_index = gl.getUniformBlockIndex(this->program_object_id, "uniform_block_name");
			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetUniformBlockIndex() failed.");

			if ((unsigned)my_uniform_block_index == GL_INVALID_INDEX)
			{
				TCU_FAIL("Uniform block not found or is considered as not active.");
			}

			gl.genBuffers(1, &buffer_object_id);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glGenBuffers() failed.");

			gl.bindBuffer(GL_UNIFORM_BUFFER, buffer_object_id);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer() failed.");

			switch (var_type_index)
			{
			case 0: //float type of uniform is considered
			{
				glw::GLfloat buffer_data[] = { 0.0f, 1.0f, 2.0f,  3.0f,  4.0f,  5.0f,  6.0f,  7.0f,
											   8.0f, 9.0f, 10.0f, 11.0f, 12.0f, 13.0f, 14.0f, 15.0f };

				gl.bufferData(GL_UNIFORM_BUFFER, sizeof(buffer_data), buffer_data, GL_STATIC_DRAW);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferData() failed.");

				break;
			}		/* float case */
			case 1: //int type of uniform is considered
			{

				glw::GLint buffer_data[] = { 0, 1, 2, 3, 4, 5, 6, 7, 8, 9, 10, 11, 12, 13, 14, 15 };

				gl.bufferData(GL_UNIFORM_BUFFER, sizeof(buffer_data), buffer_data, GL_STATIC_DRAW);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferData() failed.");

				break;
			}		/* int case */
			case 2: //uint type of uniform is considered
			{
				glw::GLuint buffer_data[] = { 0, 1, 2, 3, 4, 5, 6, 7, 8, 9, 10, 11, 12, 13, 14, 15 };

				gl.bufferData(GL_UNIFORM_BUFFER, sizeof(buffer_data), buffer_data, GL_STATIC_DRAW);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferData() failed.");

				break;
			}		/* uint case */
			case 3: //double type of uniform is considered
			{
				glw::GLdouble buffer_data[] = { 0.0, 1.0, 2.0,  3.0,  4.0,  5.0,  6.0,  7.0,
												8.0, 9.0, 10.0, 11.0, 12.0, 13.0, 14.0, 15.0 };

				gl.bufferData(GL_UNIFORM_BUFFER, sizeof(buffer_data), buffer_data, GL_STATIC_DRAW);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferData() failed.");

				break;
			} /* double case */
			default:
			{
				TCU_FAIL("Invalid variable-type index.");

				break;
			}
			} /* switch (var_type_index) */

			gl.uniformBlockBinding(this->program_object_id, my_uniform_block_index, 0);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glUniformBlockBinding() failed.");

			gl.bindBufferBase(GL_UNIFORM_BUFFER, 0, buffer_object_id);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBufferBase() failed.");

			if (TestCaseBase<API>::COMPUTE_SHADER_TYPE != tested_shader_type)
			{
				execute_draw_test(tested_shader_type);
			}
			else
			{
				execute_dispatch_test();
			}

			/* Deallocate any resources used. */
			gl.deleteBuffers(1, &buffer_object_id);
			this->delete_objects();
		} /* if var_type iterator found */
		else
		{
			TCU_FAIL("Type not found.");
		}
	} /* for (int var_type_index = 0; ...) */
}